

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_mapper.h
# Opt level: O2

uint16_t NROM_nametable_address(nes_cartridge *cartridge,uint16_t address)

{
  switch(cartridge->mirroring) {
  case NES_NAMETABLE_MIRRORING_SINGLE_LOW:
    address = address & 0x3ff;
    break;
  case NES_NAMETABLE_MIRRORING_SINGLE_HIGH:
    return address & 0x3ff | 0x800;
  case NES_NAMETABLE_MIRRORING_VERTICAL:
    return address & 0x7ff;
  case NES_NAMETABLE_MIRRORING_HORIZONTAL:
    return address & 0x3ff | (ushort)((address & 0x800) >> 1);
  }
  return address;
}

Assistant:

static uint16_t NROM_nametable_address(nes_cartridge* cartridge, uint16_t address)
{
    switch (cartridge->mirroring)
    {
        case NES_NAMETABLE_MIRRORING_VERTICAL:      address = address & 0x7FF; break;
        case NES_NAMETABLE_MIRRORING_HORIZONTAL:    address = ((address / 2) & 0x400) + (address & 0x3FF); break;
        case NES_NAMETABLE_MIRRORING_SINGLE_LOW:    address = address & 0x3FF; break;
        case NES_NAMETABLE_MIRRORING_SINGLE_HIGH:   address = 0x800 + (address & 0x3FF); break;
    }
    return address;
}